

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t vfmatch(scanner_t *scanner,char *fmt,__va_list_tag *argp)

{
  char *pcVar1;
  char c;
  byte c_00;
  uint uVar2;
  undefined4 *puVar3;
  ulong *puVar4;
  undefined4 uVar5;
  int iVar6;
  parse_status_t pVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  memptr *pmVar14;
  bool bVar15;
  bool bVar16;
  char *pcStack_b0;
  token_type_t tok_type;
  undefined8 local_98;
  __va_list_tag *local_90;
  ulong *local_88;
  token_type_t tok_type_2;
  undefined4 uStack_7c;
  int *local_78;
  memptr token_1;
  token_type_t tok_type_1;
  size_t local_58;
  memptr token;
  memptr temp_str;
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c0,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  local_90 = argp;
  if (fmt == (char *)0x0) {
    __assert_fail("fmt != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c1,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  local_58 = scanner->cursor;
  pcStack_b0 = (char *)0x4;
  iVar6 = 1;
switchD_0010a6c1_caseD_6e:
  while( true ) {
    iVar8 = iVar6;
    c = *fmt;
    pVar7 = (parse_status_t)pcStack_b0;
    if ((c == '\0') || (pVar7 != PARSE_OK)) {
      if (pVar7 != PARSE_OK) {
        scanner->cursor = local_58;
      }
      return pVar7;
    }
    pcVar1 = fmt + 1;
    iVar6 = iVar8;
    if (c != '\t') break;
    pVar7 = scanner_get_token(scanner,&token,&tok_type);
    pcStack_b0 = (char *)(ulong)pVar7;
    if (tok_type != TT_WHITESPACE) {
      pcStack_b0 = (char *)0x5;
    }
    fmt = pcVar1;
    if (pVar7 != PARSE_OK) {
      pcStack_b0 = (char *)(ulong)pVar7;
    }
  }
  if (c == ' ') {
    do {
      sVar12 = scanner->cursor;
      pVar7 = scanner_get_token(scanner,&token_1,&tok_type_2);
      pcStack_b0 = (char *)(ulong)pVar7;
      if (pVar7 != PARSE_OK) goto LAB_0010a621;
      pcStack_b0 = (char *)0x4;
      if (tok_type_2 == TT_CRLF) {
        pVar7 = scanner_get_token(scanner,&token_1,&tok_type_2);
        pcStack_b0 = (char *)(ulong)pVar7;
      }
    } while (((int)pcStack_b0 == 4) && (tok_type_2 == TT_WHITESPACE));
    scanner->cursor = sVar12;
LAB_0010a621:
    fmt = pcVar1;
    if ((int)pcStack_b0 == 1) {
      pcStack_b0 = (char *)(ulong)((uint)(scanner->entire_msg_loaded != 0) * 3 + 1);
    }
    goto switchD_0010a6c1_caseD_6e;
  }
  if (c != '%') {
    pVar7 = match_char(scanner,c,iVar8);
    pcStack_b0 = (char *)(ulong)pVar7;
    fmt = pcVar1;
    goto switchD_0010a6c1_caseD_6e;
  }
  c_00 = fmt[1];
  fmt = fmt + 2;
  if (c_00 - 0x4c < 10) {
    pmVar14 = &temp_str;
    switch((uint)c_00) {
    case 0x4c:
      uVar2 = local_90->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar9 = (long *)((ulong)uVar2 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar2 + 8;
      }
      else {
        plVar9 = (long *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = plVar9 + 1;
      }
      plVar9 = (long *)*plVar9;
      if (plVar9 == (long *)0x0) {
        __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x403,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      }
      local_98 = scanner->cursor;
      *plVar9 = (long)(scanner->msg->buf + local_98);
      do {
        pVar7 = scanner_get_token(scanner,&token_1,&tok_type_2);
        pcStack_b0 = (char *)(ulong)pVar7;
        if (pVar7 != PARSE_OK) break;
      } while (tok_type_2 != TT_CRLF);
      if (pVar7 == PARSE_OK) {
        sVar12 = scanner->cursor - token_1.length;
        scanner->cursor = sVar12;
        plVar9[1] = sVar12 - local_98;
      }
      break;
    default:
      goto switchD_0010a6c1_caseD_6f;
    case 0x50:
      uVar2 = local_90->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar10 = (undefined8 *)((ulong)uVar2 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar2 + 8;
      }
      else {
        puVar10 = (undefined8 *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar10 + 1;
      }
      if ((undefined4 *)*puVar10 == (undefined4 *)0x0) {
        __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x429,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      }
      *(undefined4 *)*puVar10 = (int)scanner->cursor;
      goto LAB_0010a9bc;
    case 0x52:
      uVar2 = local_90->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar9 = (long *)((ulong)uVar2 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar2 + 8;
      }
      else {
        plVar9 = (long *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = plVar9 + 1;
      }
      puVar4 = (ulong *)*plVar9;
      if (puVar4 == (ulong *)0x0) {
        __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3cd,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      }
      sVar12 = scanner->cursor;
      pcStack_b0 = scanner->msg->buf + sVar12;
      *puVar4 = (ulong)pcStack_b0;
      uVar13 = 0;
      local_98 = local_98 & 0xffffffff00000000;
      local_78 = (int *)0x0;
      local_88 = puVar4;
      do {
        local_88[1] = uVar13;
        bVar16 = true;
        while( true ) {
          while( true ) {
            if (!bVar16) {
              if ((int)pcStack_b0 == 4) {
                uVar13 = local_88[1];
                while (((uVar13 = uVar13 - 1, uVar13 != 0xffffffffffffffff &&
                        ((ulong)*(byte *)(*local_88 + uVar13) < 0x21)) &&
                       ((0x100002600U >> ((ulong)*(byte *)(*local_88 + uVar13) & 0x3f) & 1) != 0)))
                {
                  local_88[1] = uVar13;
                }
              }
              goto switchD_0010a6c1_caseD_6e;
            }
            pVar7 = scanner_get_token(scanner,&token_1,&tok_type_2);
            pcStack_b0 = (char *)(ulong)pVar7;
            if (pVar7 == PARSE_OK) break;
            scanner->cursor = sVar12;
            bVar16 = false;
          }
          uVar2 = local_98._4_4_;
          if ((int)local_98 == 0) break;
          bVar16 = tok_type_2 == TT_WHITESPACE;
          if (bVar16) {
            local_88[1] = local_88[1] + token_1.length;
            local_98 = (ulong)local_98._4_4_ << 0x20;
          }
          else {
            scanner->cursor = (size_t)local_78;
            local_98 = CONCAT44(local_98._4_4_,1);
          }
        }
        local_98 = (ulong)local_98._4_4_ << 0x20;
        if (tok_type_2 == TT_CRLF) {
          local_78 = (int *)(scanner->cursor - token_1.length);
          local_98 = CONCAT44(uVar2,1);
        }
        uVar13 = token_1.length + local_88[1];
      } while( true );
    case 0x53:
      uVar2 = local_90->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar9 = (long *)((ulong)uVar2 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar2 + 8;
      }
      else {
        plVar9 = (long *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = plVar9 + 1;
      }
      pmVar14 = (memptr *)*plVar9;
      if (pmVar14 == (memptr *)0x0) {
        __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f3,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      }
    case 0x55:
      local_98 = CONCAT71(local_98._1_7_,c_00);
      local_88 = (ulong *)scanner->cursor;
      pmVar14->length = 0;
      pcStack_b0 = scanner->msg->buf + (long)local_88;
      pmVar14->buf = pcStack_b0;
      bVar16 = true;
      while (bVar16) {
        pVar7 = scanner_get_token(scanner,&token_1,&tok_type_2);
        pcStack_b0 = (char *)(ulong)pVar7;
        bVar15 = tok_type_2 - TT_CTRL < 0xfffffffe;
        bVar16 = bVar15 && pVar7 == PARSE_OK;
        if (bVar15 && pVar7 == PARSE_OK) {
          pmVar14->length = pmVar14->length + token_1.length;
        }
      }
      if ((int)pcStack_b0 == 1) {
        if (scanner->entire_msg_loaded != 0) goto LAB_0010a94d;
LAB_0010a95c:
        scanner->cursor = (size_t)local_88;
      }
      else {
        if ((int)pcStack_b0 != 4) goto LAB_0010a95c;
        scanner->cursor = scanner->cursor - token_1.length;
LAB_0010a94d:
        pcStack_b0 = (char *)(ulong)((pmVar14->length == 0) + 4);
      }
      if (((char)local_98 == 'U') && ((int)pcStack_b0 == 4)) {
        uVar2 = local_90->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar10 = (undefined8 *)((ulong)uVar2 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar2 + 8;
        }
        else {
          puVar10 = (undefined8 *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = puVar10 + 1;
        }
        if ((uri_type *)*puVar10 == (uri_type *)0x0) {
          __assert_fail("uri_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f8,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        iVar8 = parse_uri(pmVar14->buf,pmVar14->length,(uri_type *)*puVar10);
        pcStack_b0 = (char *)(ulong)(iVar8 == 1 ^ 5);
      }
    }
    goto switchD_0010a6c1_caseD_6e;
  }
  pcStack_b0 = (char *)0x4;
  iVar6 = 1;
  switch(c_00) {
  case 0x6e:
    goto switchD_0010a6c1_caseD_6e;
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
    goto switchD_0010a6c1_caseD_6f;
  case 0x71:
    uVar2 = local_90->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar2 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar2 + 8;
    }
    else {
      puVar10 = (undefined8 *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = puVar10 + 1;
    }
    pVar7 = scanner_get_token(scanner,(memptr *)*puVar10,&tok_type);
    bVar16 = tok_type == TT_QUOTEDSTRING;
    break;
  case 0x73:
    uVar2 = local_90->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar2 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar2 + 8;
    }
    else {
      puVar10 = (undefined8 *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = puVar10 + 1;
    }
    if ((memptr *)*puVar10 == (memptr *)0x0) {
      __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3d2,
                    "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
    }
    pVar7 = scanner_get_token(scanner,(memptr *)*puVar10,&tok_type);
    bVar16 = tok_type == TT_IDENTIFIER;
    break;
  case 0x77:
    pVar7 = scanner_get_token(scanner,&token,&tok_type);
    pcStack_b0 = (char *)(ulong)pVar7;
    iVar6 = iVar8;
    if ((pVar7 == PARSE_OK) && (tok_type != TT_WHITESPACE)) {
      scanner->cursor = scanner->cursor - token.length;
LAB_0010a9bc:
      pcStack_b0 = (char *)0x4;
      iVar6 = iVar8;
    }
    goto switchD_0010a6c1_caseD_6e;
  case 0x78:
switchD_0010a6c1_caseD_78:
    uVar2 = local_90->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar9 = (long *)((ulong)uVar2 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar2 + 8;
    }
    else {
      plVar9 = (long *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = plVar9 + 1;
    }
    puVar3 = (undefined4 *)*plVar9;
    if (puVar3 == (undefined4 *)0x0) {
      __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",1000,
                    "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
    }
    uVar5 = 0x10;
    if (c_00 == 100) {
      uVar5 = 10;
    }
    local_88 = (ulong *)CONCAT44(local_88._4_4_,uVar5);
    local_98 = scanner->cursor;
    pVar7 = scanner_get_token(scanner,&token_1,&tok_type_1);
    pcStack_b0 = (char *)(ulong)pVar7;
    if ((pVar7 == PARSE_OK) && (pcStack_b0 = (char *)0x5, tok_type_1 == TT_IDENTIFIER)) {
      local_78 = __errno_location();
      *local_78 = 0;
      lVar11 = strtol(token_1.buf,(char **)&tok_type_2,(int)local_88);
      if (((-1 < lVar11) && ((char *)CONCAT44(uStack_7c,tok_type_2) == token_1.buf + token_1.length)
          ) && ((lVar11 != 0x7fffffffffffffff || (*local_78 != 0x22)))) {
        *puVar3 = (int)lVar11;
        goto LAB_0010a9bc;
      }
      *puVar3 = (int)lVar11;
      pcStack_b0 = (char *)0x5;
    }
    scanner->cursor = local_98;
    iVar6 = iVar8;
    goto switchD_0010a6c1_caseD_6e;
  default:
    if ((c_00 == 0x20) || (c_00 == 0x25)) {
      pVar7 = match_char(scanner,c_00,iVar8);
      pcStack_b0 = (char *)(ulong)pVar7;
      iVar6 = iVar8;
      goto switchD_0010a6c1_caseD_6e;
    }
    if (c_00 == 0x30) {
      if ((scanner->cursor != scanner->msg->length) ||
         (pcStack_b0 = (char *)0x4, iVar6 = iVar8, scanner->msg->buf[scanner->cursor] != '\0')) {
        pcStack_b0 = (char *)0x5;
        iVar6 = iVar8;
      }
      goto switchD_0010a6c1_caseD_6e;
    }
    if (c_00 != 99) {
      if (c_00 == 100) goto switchD_0010a6c1_caseD_78;
      if (c_00 != 0x69) goto switchD_0010a6c1_caseD_6f;
      pcStack_b0 = (char *)0x4;
      iVar6 = 0;
      goto switchD_0010a6c1_caseD_6e;
    }
    pVar7 = scanner_get_token(scanner,&token,&tok_type);
    bVar16 = tok_type == TT_CRLF;
  }
  pcStack_b0 = (char *)(ulong)pVar7;
  if (!bVar16) {
    pcStack_b0 = (char *)0x5;
  }
  iVar6 = iVar8;
  if (pVar7 != PARSE_OK) {
    pcStack_b0 = (char *)(ulong)pVar7;
  }
  goto switchD_0010a6c1_caseD_6e;
switchD_0010a6c1_caseD_6f:
  __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x43a,
                "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
}

Assistant:

static parse_status_t vfmatch(scanner_t *scanner, const char *fmt, va_list argp)
{
	char c;
	const char *fmt_ptr = fmt;
	parse_status_t status;
	memptr *str_ptr;
	memptr temp_str;
	int *int_ptr;
	uri_type *uri_ptr;
	size_t save_pos;
	int stat;
	int case_sensitive = 1;
	memptr token;
	token_type_t tok_type;
	int base;

	assert(scanner != NULL);
	assert(fmt != NULL);

	/* save scanner pos; to aid error recovery */
	save_pos = scanner->cursor;

	status = PARSE_OK;
	while ((c = *fmt_ptr++) && (status == (parse_status_t)PARSE_OK)) {
		if (c == '%') {
			c = *fmt_ptr++;
			switch (c) {
			case 'R': /* raw value */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = match_raw_value(scanner, str_ptr);
				break;
			case 's': /* simple identifier */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_IDENTIFIER) {
					/* not an identifier */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'c': /* crlf */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type != (token_type_t)TT_CRLF) {
					/* not CRLF token */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'd': /* integer */
			case 'x': /* hex number */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				base = c == 'd' ? 10 : 16;
				status = match_int(scanner, base, int_ptr);
				break;
			case 'S': /* non-whitespace string */
			case 'U': /* uri */
				if (c == 'S') {
					str_ptr = va_arg(argp, memptr *);
				} else {
					str_ptr = &temp_str;
				}
				assert(str_ptr != NULL);
				status = match_non_ws_string(scanner, str_ptr);
				if (c == 'U' &&
					status == (parse_status_t)PARSE_OK) {
					uri_ptr = va_arg(argp, uri_type *);
					assert(uri_ptr != NULL);
					stat = parse_uri(str_ptr->buf,
						str_ptr->length,
						uri_ptr);
					if (stat != HTTP_SUCCESS) {
						status = PARSE_NO_MATCH;
					}
				}
				break;
			case 'L': /* string till eol */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = read_until_crlf(scanner, str_ptr);
				break;
			case ' ': /* match space */
			case '%': /* match percentage symbol */
				status = match_char(scanner, c, case_sensitive);
				break;
			case 'n': /* case-sensitive match */
				case_sensitive = 1;
				break;
			case 'i': /* ignore case */
				case_sensitive = 0;
				break;
			case 'q': /* quoted string */
				str_ptr = (memptr *)va_arg(argp, memptr *);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_QUOTEDSTRING) {
					status = PARSE_NO_MATCH; /* not a quoted
								    string */
				}
				break;
			case 'w':
				/* optional whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* restore non-whitespace token */
					scanner->cursor -= token.length;
				}
				break;
			case 'P':
				/* current pos of scanner */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				*int_ptr = (int)scanner->cursor;
				break;
				/* valid only in matchstr() */
			case '0':
				/* end of msg? */
				/* check that we are 1 beyond last char */
				if (scanner->cursor == scanner->msg->length &&
					scanner->msg->buf[scanner->cursor] ==
						'\0') {
					status = PARSE_OK;
				} else {
					status = PARSE_NO_MATCH;
				}
				break;
			default:
				/* unknown option */
				assert(0);
			}
		} else {
			switch (c) {
			case ' ': /* LWS* */
				status = skip_lws(scanner);
				break;
			case '\t': /* Whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* not whitespace token */
					status = PARSE_NO_MATCH;
				}
				break;
			default: /* match characters */
			{
				status = match_char(scanner, c, case_sensitive);
			}
			}
		}
	}
	if (status != (parse_status_t)PARSE_OK) {
		/* on error, restore original scanner pos */
		scanner->cursor = save_pos;
	}

	return status;
}